

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteHelpRule
          (cmGlobalUnixMakefileGenerator3 *this,ostream *ruleFileStream,
          cmLocalUnixMakefileGenerator3 *lg)

{
  _Base_ptr *pp_Var1;
  pointer ppcVar2;
  cmLocalUnixMakefileGenerator3 *pcVar3;
  pointer ppcVar4;
  cmGeneratorTarget *this_00;
  pointer pbVar5;
  bool bVar6;
  TargetType TVar7;
  string *__v;
  string *o;
  pointer pbVar8;
  pointer ppcVar9;
  pointer ppcVar10;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar11;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emittedTargets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  string path;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_depends;
  
  path._M_dataplus._M_p = (pointer)&path.field_2;
  path._M_string_length = 0;
  path.field_2._M_local_buf[0] = '\0';
  no_depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  no_depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  no_depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pp_Var1 = &emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  emittedTargets._M_t._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&emittedTargets,
             "The following are some of the valid targets for this Makefile:","");
  cmLocalUnixMakefileGenerator3::AppendEcho
            (lg,&commands,(string *)&emittedTargets,EchoNormal,(EchoProgress *)0x0);
  if ((_Base_ptr *)emittedTargets._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)emittedTargets._M_t._M_impl._0_8_,
                    (ulong)((long)&(emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  emittedTargets._M_t._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&emittedTargets,"... all (the default if no target is provided)","");
  cmLocalUnixMakefileGenerator3::AppendEcho
            (lg,&commands,(string *)&emittedTargets,EchoNormal,(EchoProgress *)0x0);
  if ((_Base_ptr *)emittedTargets._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)emittedTargets._M_t._M_impl._0_8_,
                    (ulong)((long)&(emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  emittedTargets._M_t._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&emittedTargets,"... clean","");
  cmLocalUnixMakefileGenerator3::AppendEcho
            (lg,&commands,(string *)&emittedTargets,EchoNormal,(EchoProgress *)0x0);
  if ((_Base_ptr *)emittedTargets._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)emittedTargets._M_t._M_impl._0_8_,
                    (ulong)((long)&(emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  emittedTargets._M_t._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&emittedTargets,"CMAKE_SUPPRESS_REGENERATION","");
  bVar6 = cmGlobalGenerator::GlobalSettingIsOn((cmGlobalGenerator *)this,(string *)&emittedTargets);
  if ((_Base_ptr *)emittedTargets._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)emittedTargets._M_t._M_impl._0_8_,
                    (ulong)((long)&(emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  if (!bVar6) {
    emittedTargets._M_t._M_impl._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&emittedTargets,"... depend","");
    cmLocalUnixMakefileGenerator3::AppendEcho
              (lg,&commands,(string *)&emittedTargets,EchoNormal,(EchoProgress *)0x0);
    if ((_Base_ptr *)emittedTargets._M_t._M_impl._0_8_ != pp_Var1) {
      operator_delete((void *)emittedTargets._M_t._M_impl._0_8_,
                      (ulong)((long)&(emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
  }
  emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header;
  emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  emittedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppcVar10 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppcVar2 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (ppcVar10 != ppcVar2) {
    do {
      pcVar3 = (cmLocalUnixMakefileGenerator3 *)*ppcVar10;
      if (pcVar3 == lg) {
LAB_003632d1:
        ppcVar4 = (pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
                  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (ppcVar9 = (pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                       GeneratorTargets.
                       super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                       ._M_impl.super__Vector_impl_data._M_start; ppcVar9 != ppcVar4;
            ppcVar9 = ppcVar9 + 1) {
          this_00 = *ppcVar9;
          TVar7 = cmGeneratorTarget::GetType(this_00);
          if (TVar7 < INTERFACE_LIBRARY) {
            __v = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
            pVar11 = std::
                     _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                     ::_M_insert_unique<std::__cxx11::string_const&>
                               ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                 *)&emittedTargets,__v);
            if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              std::__cxx11::string::_M_replace
                        ((ulong)&path,0,(char *)path._M_string_length,0x563795);
              std::__cxx11::string::_M_append((char *)&path,(ulong)(__v->_M_dataplus)._M_p);
              cmLocalUnixMakefileGenerator3::AppendEcho
                        (lg,&commands,&path,EchoNormal,(EchoProgress *)0x0);
            }
          }
        }
      }
      else {
        bVar6 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)lg);
        if (bVar6) goto LAB_003632d1;
      }
      ppcVar10 = ppcVar10 + 1;
    } while (ppcVar10 != ppcVar2);
  }
  pbVar8 = (lg->LocalHelp).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (lg->LocalHelp).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar8 != pbVar5) {
    do {
      std::__cxx11::string::_M_replace((ulong)&path,0,(char *)path._M_string_length,0x563795);
      std::__cxx11::string::_M_append((char *)&path,(ulong)(pbVar8->_M_dataplus)._M_p);
      cmLocalUnixMakefileGenerator3::AppendEcho(lg,&commands,&path,EchoNormal,(EchoProgress *)0x0);
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != pbVar5);
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"help","");
  cmLocalUnixMakefileGenerator3::WriteMakeRule
            (lg,ruleFileStream,"Help Target",&local_68,&no_depends,&commands,true,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(ruleFileStream,"\n\n",2);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&emittedTargets._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&commands);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&no_depends);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)path._M_dataplus._M_p != &path.field_2) {
    operator_delete(path._M_dataplus._M_p,
                    CONCAT71(path.field_2._M_allocated_capacity._1_7_,path.field_2._M_local_buf[0])
                    + 1);
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteHelpRule(
  std::ostream& ruleFileStream, cmLocalUnixMakefileGenerator3* lg)
{
  // add the help target
  std::string path;
  std::vector<std::string> no_depends;
  std::vector<std::string> commands;
  lg->AppendEcho(commands,
                 "The following are some of the valid targets "
                 "for this Makefile:");
  lg->AppendEcho(commands, "... all (the default if no target is provided)");
  lg->AppendEcho(commands, "... clean");
  if (!this->GlobalSettingIsOn("CMAKE_SUPPRESS_REGENERATION")) {
    lg->AppendEcho(commands, "... depend");
  }

  // Keep track of targets already listed.
  std::set<std::string> emittedTargets;

  // for each local generator
  for (cmLocalGenerator* localGen : this->LocalGenerators) {
    cmLocalUnixMakefileGenerator3* lg2 =
      static_cast<cmLocalUnixMakefileGenerator3*>(localGen);
    // for the passed in makefile or if this is the top Makefile wripte out
    // the targets
    if (lg2 == lg || lg->IsRootMakefile()) {
      // for each target Generate the rule files for each target.
      for (cmGeneratorTarget* target : lg2->GetGeneratorTargets()) {
        cmStateEnums::TargetType type = target->GetType();
        if ((type == cmStateEnums::EXECUTABLE) ||
            (type == cmStateEnums::STATIC_LIBRARY) ||
            (type == cmStateEnums::SHARED_LIBRARY) ||
            (type == cmStateEnums::MODULE_LIBRARY) ||
            (type == cmStateEnums::OBJECT_LIBRARY) ||
            (type == cmStateEnums::GLOBAL_TARGET) ||
            (type == cmStateEnums::UTILITY)) {
          std::string const& name = target->GetName();
          if (emittedTargets.insert(name).second) {
            path = "... ";
            path += name;
            lg->AppendEcho(commands, path);
          }
        }
      }
    }
  }
  for (std::string const& o : lg->GetLocalHelp()) {
    path = "... ";
    path += o;
    lg->AppendEcho(commands, path);
  }
  lg->WriteMakeRule(ruleFileStream, "Help Target", "help", no_depends,
                    commands, true);
  ruleFileStream << "\n\n";
}